

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O0

int SUNLinSol_SPGMRSetMaxRestarts(SUNLinearSolver S,int maxrs)

{
  int maxrs_local;
  SUNLinearSolver S_local;
  int local_4;
  
  maxrs_local = maxrs;
  if (maxrs < 0) {
    maxrs_local = 0;
  }
  if (S == (SUNLinearSolver)0x0) {
    local_4 = -0x321;
  }
  else {
    *(int *)((long)S->content + 0xc) = maxrs_local;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SUNLinSol_SPGMRSetMaxRestarts(SUNLinearSolver S, int maxrs)
{
  /* Illegal maxrs implies use of default value */
  if (maxrs < 0)
    maxrs = SUNSPGMR_MAXRS_DEFAULT;

  /* Check for non-NULL SUNLinearSolver */
  if (S == NULL) return(SUNLS_MEM_NULL);

  /* Set max_restarts */
  SPGMR_CONTENT(S)->max_restarts = maxrs;
  return(SUNLS_SUCCESS);
}